

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

CompositeISE *
Saturation::SaturationAlgorithm::createISE
          (Problem *prb,Options *opt,Ordering *ordering,bool alascaTakesOver)

{
  Condensation CVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  CompositeISE *this;
  EquationalTautologyRemoval *this_00;
  ImmediateSimplificationEngine *pIVar6;
  SimplifyingGeneratingInference1 *pSVar7;
  InterpretedEvaluation *this_01;
  PolynomialEvaluationRule *this_02;
  UndesiredAnswerLiteralRemoval *this_03;
  SimplifyingGeneratingInference1 **ppSVar8;
  undefined *puVar9;
  undefined1 local_50 [32];
  
  this = (CompositeISE *)::operator_new(0x20);
  (this->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  (this->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_009fb8e0;
  this->_inners = (ISList *)0x0;
  this->_innersMany = (ISList *)0x0;
  bVar4 = couldEqualityArise(prb,opt);
  if ((bVar4) &&
     ((opt->_equationalTautologyRemoval).super_OptionValue<bool>.super_AbstractOptionValue.
      field_0x92 == '\x01')) {
    this_00 = (EquationalTautologyRemoval *)::operator_new(400);
    Inferences::EquationalTautologyRemoval::EquationalTautologyRemoval(this_00);
    Inferences::CompositeISE::addFront(this,(ImmediateSimplificationEngine *)this_00);
  }
  CVar1 = (opt->_condensation).super_OptionValue<Shell::Options::Condensation>.actualValue;
  if (CVar1 == ON) {
    puVar9 = &Inferences::Condensation::vtable;
LAB_005098e1:
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)(puVar9 + 0x10);
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  else if (CVar1 == FAST) {
    puVar9 = &Inferences::FastCondensation::vtable;
    goto LAB_005098e1;
  }
  if (*(char *)(Lib::env + 0xee42) == '\x01') {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009f9d90;
    Inferences::CompositeISE::addFront(this,pIVar6);
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009f9e48;
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  if (*(char *)(Lib::env + 0xf1a2) == '\x01') {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009fbae0;
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  bVar5 = Kernel::Problem::hasLogicalProxy(prb);
  if (bVar5) {
LAB_005099c6:
    bVar5 = Kernel::Problem::isHigherOrder(prb);
    if ((bVar5) && (*(char *)(Lib::env + 0xed6a) == '\0')) {
      iVar2 = *(int *)(Lib::env + 0xf538);
      pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      if (iVar2 == 0) {
        (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
             (_func_int **)&PTR__InferenceEngine_009f9640;
        Inferences::CompositeISE::addFrontMany(this,pIVar6);
      }
      else {
        (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
             (_func_int **)&PTR__InferenceEngine_009f95e0;
        Inferences::CompositeISE::addFront(this,pIVar6);
      }
      pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_009f94c8;
      Inferences::CompositeISE::addFront(this,pIVar6);
    }
  }
  else {
    bVar5 = Kernel::Problem::hasBoolVar(prb);
    if (bVar5) goto LAB_005099c6;
    bVar5 = Kernel::Problem::hasFOOL(prb);
    if (bVar5) goto LAB_005099c6;
  }
  bVar5 = Kernel::Problem::hasFOOL(prb);
  if (((bVar5) &&
      ((opt->_casesSimp).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01')) &&
     ((opt->_cases).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\0')) {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009f9980;
    Inferences::CompositeISE::addFrontMany(this,pIVar6);
  }
  if (bVar4) {
    if (*(char *)(DAT_00a14190 + 0x1c8) == '\x01') {
      pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_009f9f08;
      Inferences::CompositeISE::addFront(this,pIVar6);
    }
    if ((*(int *)(DAT_00a14190 + 0x26c) != 0) &&
       ((opt->_termAlgebraInferences).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92
        == '\x01')) {
      pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_009fc9d0;
      Inferences::CompositeISE::addFront(this,pIVar6);
      pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_009fca90;
      Inferences::CompositeISE::addFront(this,pIVar6);
      pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_009fcaf0;
      Inferences::CompositeISE::addFront(this,pIVar6);
    }
  }
  bVar5 = Kernel::Problem::hasInterpretedOperations(prb);
  if (!bVar5) {
    bVar5 = Kernel::Problem::hasNumerals(prb);
    if (!bVar5) goto LAB_00509d08;
  }
  if (*(int *)(Lib::env + 0xeb98) == 0) {
    Inferences::allArithmeticSubtermGeneralizations();
    for (ppSVar8 = (SimplifyingGeneratingInference1 **)local_50._8_8_;
        ppSVar8 != (SimplifyingGeneratingInference1 **)local_50._16_8_; ppSVar8 = ppSVar8 + 1) {
      pIVar6 = Inferences::SimplifyingGeneratingInference1::asISE(*ppSVar8);
      Inferences::CompositeISE::addFront(this,pIVar6);
    }
    Lib::Stack<Inferences::SimplifyingGeneratingInference1_*>::~Stack
              ((Stack<Inferences::SimplifyingGeneratingInference1_*> *)local_50);
  }
  if (*(int *)(Lib::env + 0xe488) == 0) {
    pSVar7 = (SimplifyingGeneratingInference1 *)::operator_new(0x20);
    (pSVar7->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)0x0;
    (pSVar7->super_SimplifyingGeneratingInference).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar7->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)0x0;
    (pSVar7->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar7->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)&PTR__SimplifyingGeneratingInference1_009fae48;
    (pSVar7->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)&PTR__GaussianVariableElimination_009fae98;
    pIVar6 = Inferences::SimplifyingGeneratingInference1::asISE(pSVar7);
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  if (*(int *)(Lib::env + 0xea98) == 0) {
    pSVar7 = (SimplifyingGeneratingInference1 *)::operator_new(0x30);
    Inferences::Cancellation::Cancellation((Cancellation *)pSVar7,ordering);
    pIVar6 = Inferences::SimplifyingGeneratingInference1::asISE(pSVar7);
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  lVar3 = Lib::env;
  if (!alascaTakesOver) {
    if (*(int *)(Lib::env + 0xc7f8) == 2) {
      this_02 = (PolynomialEvaluationRule *)::operator_new(0x58);
      Inferences::PolynomialEvaluationRule::PolynomialEvaluationRule(this_02,ordering);
      this_01 = (InterpretedEvaluation *)
                Inferences::SimplifyingGeneratingInference1::asISE
                          ((SimplifyingGeneratingInference1 *)this_02);
    }
    else {
      if (*(int *)(Lib::env + 0xc7f8) != 1) goto LAB_00509cce;
      this_01 = (InterpretedEvaluation *)::operator_new(0x18);
      Inferences::InterpretedEvaluation::InterpretedEvaluation
                (this_01,*(bool *)(lVar3 + 0xe2d2),ordering);
    }
    Inferences::CompositeISE::addFront(this,&this_01->super_ImmediateSimplificationEngine);
  }
LAB_00509cce:
  if (*(char *)(Lib::env + 0xe3aa) == '\x01') {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__PushUnaryMinus_009fc6f8;
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
LAB_00509d08:
  if (bVar4) {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009fbc00;
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x18);
  (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fc970;
  *(undefined1 *)&pIVar6[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(this,pIVar6);
  if (*(char *)(Lib::env + 0xfd42) == '\x01') {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009fbba0;
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fbb40;
  Inferences::CompositeISE::addFront(this,pIVar6);
  if (*(int *)(Lib::env + 0x8898) == 2) {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009fc1c0;
    Inferences::CompositeISE::addFront(this,pIVar6);
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_009fc220;
    Inferences::CompositeISE::addFront(this,pIVar6);
  }
  else if (*(int *)(Lib::env + 0x8898) == 1) {
    pIVar6 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00a03a90;
    Inferences::CompositeISE::addFront(this,pIVar6);
    std::__cxx11::string::string((string *)local_50,(string *)(Lib::env + 0x8a90));
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"");
    std::__cxx11::string::~string((string *)local_50);
    if (bVar4) {
      this_03 = (UndesiredAnswerLiteralRemoval *)::operator_new(0x18);
      std::__cxx11::string::string((string *)local_50,(string *)(Lib::env + 0x8a90));
      Inferences::UndesiredAnswerLiteralRemoval::UndesiredAnswerLiteralRemoval
                (this_03,(string *)local_50);
      Inferences::CompositeISE::addFront(this,(ImmediateSimplificationEngine *)this_03);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return this;
}

Assistant:

CompositeISE* SaturationAlgorithm::createISE(Problem& prb, const Options& opt, Ordering& ordering, bool alascaTakesOver)
{
  CompositeISE* res =new CompositeISE();

  bool mayHaveEquality = couldEqualityArise(prb,opt);

  if (mayHaveEquality && opt.equationalTautologyRemoval()) {
    res->addFront(new EquationalTautologyRemoval());
  }

  switch (opt.condensation()) {
    case Options::Condensation::ON:
      res->addFront(new Condensation());
      break;
    case Options::Condensation::FAST:
      res->addFront(new FastCondensation());
      break;
    case Options::Condensation::OFF:
      break;
  }

  if (env.options->combinatorySup()) {
    res->addFront(new CombinatorDemodISE());
    res->addFront(new CombinatorNormalisationISE());
  }

  if (env.options->choiceReasoning()) {
    res->addFront(new ChoiceDefinitionISE());
  }

  if((prb.hasLogicalProxy() || prb.hasBoolVar() || prb.hasFOOL()) &&
      prb.isHigherOrder() && !env.options->addProxyAxioms()){
    if(env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER){
      /*res->addFrontMany(new ProxyISE());
      res->addFront(new OrImpAndProxyISE());
      res->addFront(new NotProxyISE());
      res->addFront(new EqualsProxyISE());
      res->addFront(new PiSigmaProxyISE());*/
      res->addFrontMany(new EagerClausificationISE());
    }
    else {
      res->addFront(new IFFXORRewriterISE());
    }
    res->addFront(new BoolSimp());
  }

  if (prb.hasFOOL() && opt.casesSimp() && !opt.cases()) {
    res->addFrontMany(new CasesSimp());
  }

  // Only add if there are distinct groups
  if (mayHaveEquality && env.signature->hasDistinctGroups()) {
    res->addFront(new DistinctEqualitySimplifier());
  }
  if (mayHaveEquality && env.signature->hasTermAlgebras()) {
    if (opt.termAlgebraInferences()) {
      res->addFront(new DistinctnessISE());
      res->addFront(new InjectivityISE());
      res->addFront(new NegativeInjectivityISE());
    }
  }
  if (prb.hasInterpretedOperations() || prb.hasNumerals()) {
    if (env.options->arithmeticSubtermGeneralizations() == Options::ArithmeticSimplificationMode::FORCE) {
      for (auto gen : allArithmeticSubtermGeneralizations()) {
        res->addFront(&gen->asISE());
      }
    }

    if (env.options->gaussianVariableElimination() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new GaussianVariableElimination())->asISE());
    }

    if (env.options->cancellation() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new Cancellation(ordering))->asISE());
    }

    if (alascaTakesOver) {
      // all alasca rules are added later
    } else switch (env.options->evaluationMode()) {
      case Options::EvaluationMode::OFF:
        break;
      case Options::EvaluationMode::SIMPLE:
        res->addFront(new InterpretedEvaluation(env.options->inequalityNormalization(), ordering));
        break;
      case Options::EvaluationMode::POLYNOMIAL_FORCE:
        res->addFront(&(new PolynomialEvaluationRule(ordering))->asISE());
        break;
      case Options::EvaluationMode::POLYNOMIAL_CAUTIOUS:
        break;
    }

    if (env.options->pushUnaryMinus()) {
      res->addFront(new PushUnaryMinus());
    }
  }
  if (mayHaveEquality) {
    res->addFront(new TrivialInequalitiesRemovalISE());
  }
  res->addFront(new TautologyDeletionISE());
  if (env.options->newTautologyDel()) {
    res->addFront(new TautologyDeletionISE2());
  }
  res->addFront(new DuplicateLiteralRemovalISE());

  if (env.options->questionAnswering() == Options::QuestionAnsweringMode::PLAIN) {
    res->addFront(new AnswerLiteralResolver());
    if (env.options->questionAnsweringAvoidThese() != "") {
      res->addFront(new UndesiredAnswerLiteralRemoval(env.options->questionAnsweringAvoidThese()));
    }
  } else if (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS) {
    res->addFront(new UncomputableAnswerLiteralRemoval());
    res->addFront(new MultipleAnswerLiteralRemoval());
  }
  return res;
}